

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GenericProperty.h
# Opt level: O3

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
GetGenericProperty<std::__cxx11::string>
          (map<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           *list,char *szName,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *errorReturn)

{
  uint uVar1;
  uint uVar2;
  size_t sVar3;
  _Base_ptr p_Var4;
  _Rb_tree_color _Var5;
  _Base_ptr p_Var6;
  uint uVar7;
  _Rb_tree_header *p_Var8;
  bool bVar9;
  
  if (szName == (char *)0x0) {
    __assert_fail("nullptr != szName",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/include/assimp/GenericProperty.h"
                  ,0x4b,
                  "const T &GetGenericProperty(const std::map<unsigned int, T> &, const char *, const T &) [T = std::basic_string<char>]"
                 );
  }
  sVar3 = strlen(szName);
  uVar2 = (uint)sVar3;
  uVar7 = 0;
  if (3 < uVar2) {
    uVar1 = uVar2 >> 2;
    uVar7 = 0;
    do {
      uVar7 = (*(ushort *)szName + uVar7) * 0x10000 ^
              (uint)*(ushort *)((long)szName + 2) << 0xb ^ *(ushort *)szName + uVar7;
      szName = (char *)((long)szName + 4);
      uVar7 = (uVar7 >> 0xb) + uVar7;
      uVar1 = uVar1 - 1;
    } while (uVar1 != 0);
  }
  switch(uVar2 & 3) {
  case 0:
    goto switchD_0038e861_caseD_0;
  case 1:
    uVar7 = uVar7 + (int)(char)*(ushort *)szName;
    uVar2 = uVar7 * 0x400 ^ uVar7;
    uVar7 = uVar2 >> 1;
    break;
  case 2:
    uVar2 = (uVar7 + *(ushort *)szName) * 0x800 ^ uVar7 + *(ushort *)szName;
    uVar7 = uVar2 >> 0x11;
    break;
  case 3:
    uVar7 = (uVar7 + *(ushort *)szName) * 0x10000 ^
            (int)(char)*(ushort *)((long)szName + 2) << 0x12 ^ uVar7 + *(ushort *)szName;
    uVar2 = uVar7 >> 0xb;
  }
  uVar7 = uVar7 + uVar2;
switchD_0038e861_caseD_0:
  p_Var4 = (list->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent;
  if (p_Var4 != (_Base_ptr)0x0) {
    uVar7 = uVar7 * 8 ^ uVar7;
    uVar7 = (uVar7 >> 5) + uVar7;
    uVar7 = uVar7 * 0x10 ^ uVar7;
    uVar7 = (uVar7 >> 0x11) + uVar7;
    uVar7 = uVar7 * 0x2000000 ^ uVar7;
    _Var5 = (uVar7 >> 6) + uVar7;
    p_Var8 = &(list->_M_t)._M_impl.super__Rb_tree_header;
    p_Var6 = &p_Var8->_M_header;
    do {
      bVar9 = p_Var4[1]._M_color < _Var5;
      if (!bVar9) {
        p_Var6 = p_Var4;
      }
      p_Var4 = (&p_Var4->_M_left)[bVar9];
    } while (p_Var4 != (_Base_ptr)0x0);
    if (((_Rb_tree_header *)p_Var6 != p_Var8) && (p_Var6[1]._M_color <= _Var5)) {
      errorReturn = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    &p_Var6[1]._M_parent;
    }
  }
  return errorReturn;
}

Assistant:

inline
const T& GetGenericProperty(const std::map< unsigned int, T >& list,
        const char* szName, const T& errorReturn) {
    ai_assert(nullptr != szName);
    const uint32_t hash = SuperFastHash(szName);

    typename std::map<unsigned int, T>::const_iterator it = list.find(hash);
    if (it == list.end()) {
        return errorReturn;
    }

    return (*it).second;
}